

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
pbrt::FilmBaseParameters::FilmBaseParameters
          (FilmBaseParameters *this,ParameterDictionary *parameters,FilterHandle *filter,
          PixelSensor *sensor,FileLoc *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  Tuple2<pbrt::Point2,_int> TVar15;
  int iVar16;
  Tuple2<pbrt::Point2,_int> TVar17;
  int iVar18;
  Tuple2<pbrt::Point2,_int> TVar19;
  Tuple2<pbrt::Point2,_int> TVar20;
  ulong uVar21;
  Tuple2<pbrt::Point2,_int> TVar22;
  Tuple2<pbrt::Point2,_int> TVar23;
  Tuple2<pbrt::Point2,_int> TVar24;
  Tuple2<pbrt::Point2,_int> TVar25;
  Tuple2<pbrt::Point2,_int> TVar26;
  float fVar27;
  Float FVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vector<int,_std::allocator<int>_> pb;
  vector<float,_std::allocator<float>_> cr;
  string local_b0;
  FileLoc *local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  int local_34;
  
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x0;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = 0;
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x7fffffff7fffffff;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)0x8000000080000000;
  (this->filter).
  super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  .bits = (filter->
          super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
          ).bits;
  this->sensor = sensor;
  local_68 = &this->filename;
  local_40 = &(this->filename).field_2;
  (this->filename)._M_dataplus._M_p = (pointer)local_40;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  paVar1 = &local_88.field_2;
  local_90 = loc;
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"filename","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
  ParameterDictionary::GetOneString(&local_b0,parameters,&local_88,&local_60);
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  sVar5 = (this->filename)._M_string_length;
  if (*(long *)(Options + 0x30) == 0) {
    if (sVar5 == 0) {
      std::__cxx11::string::_M_replace((ulong)local_68,0,(char *)0x0,0x28d977d);
    }
  }
  else {
    if (sVar5 != 0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<std::__cxx11::string&,std::__cxx11::string&>
                (&local_b0,
                 "Output filename supplied on command line, \"%s\" will override filename provided in scene description file, \"%s\"."
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (Options + 0x28),local_68);
      Warning(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
    std::__cxx11::string::_M_assign((string *)local_68);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"xresolution","");
  iVar10 = ParameterDictionary::GetOneInt(parameters,&local_b0,0x500);
  local_88._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"yresolution","");
  iVar11 = ParameterDictionary::GetOneInt(parameters,&local_88,0x2d0);
  TVar17.y = iVar11;
  TVar17.x = iVar10;
  (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = TVar17;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (*(char *)(Options + 8) == '\x01') {
    auVar29._8_8_ = 0;
    auVar29._0_8_ = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>;
    auVar32 = vpsrad_avx(auVar29,0x1f);
    auVar32 = vpsrld_avx(auVar32,0x1e);
    auVar32 = vpaddd_avx(auVar29,auVar32);
    auVar29 = vpsrad_avx(auVar32,2);
    auVar32._8_4_ = 1;
    auVar32._0_8_ = 0x100000001;
    auVar32._12_4_ = 1;
    auVar32 = vpmaxsd_avx512vl(auVar29,auVar32);
    (this->fullResolution).super_Tuple2<pbrt::Point2,_int> = auVar32._0_8_;
  }
  uVar2 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
  uVar3 = (this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
  TVar19.x = (int)uVar2 >> 0x1f & uVar2;
  TVar19.y = (int)uVar3 >> 0x1f & uVar3;
  uVar21 = 0;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar13 = uVar21;
  }
  if (0 < (int)uVar3) {
    uVar21 = (ulong)uVar3;
  }
  (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar19;
  (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> =
       (Tuple2<pbrt::Point2,_int>)(uVar13 | uVar21 << 0x20);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"pixelbounds","");
  ParameterDictionary::GetIntArray
            ((vector<int,_std::allocator<int>_> *)&local_88,parameters,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (*(char *)(Options + 0xec) == '\x01') {
    iVar10 = *(int *)(Options + 0xdc);
    iVar11 = *(int *)(Options + 0xe0);
    iVar12 = *(int *)(Options + 0xe4);
    iVar16 = *(int *)(Options + 0xe8);
    if (((iVar10 < (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x) ||
        (iVar11 < (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y)) ||
       (((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar12 ||
        ((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar16)))) {
      Warning(local_90,"Supplied pixel bounds extend beyond image resolution. Clamping.");
    }
    iVar18 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar4 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar18 < iVar10) {
      iVar18 = iVar10;
    }
    if (iVar4 < iVar11) {
      iVar4 = iVar11;
    }
    TVar14.y = iVar4;
    TVar14.x = iVar18;
    iVar10 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
    if (iVar10 < iVar12) {
      iVar12 = iVar10;
    }
    iVar10 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar10 < iVar16) {
      iVar16 = iVar10;
    }
    TVar25.y = iVar16;
    TVar25.x = iVar12;
    (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar14;
    (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar25;
    if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
      Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.");
    }
  }
  else if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
    if (local_88._M_string_length - (long)local_88._M_dataplus._M_p == 0x10) {
      iVar10 = *(int *)(local_88._M_dataplus._M_p + 8);
      iVar11 = *(int *)local_88._M_dataplus._M_p;
      iVar12 = *(int *)(local_88._M_dataplus._M_p + 4);
      iVar16 = *(int *)(local_88._M_dataplus._M_p + 0xc);
      iVar18 = iVar11;
      if (iVar12 < iVar11) {
        iVar18 = iVar12;
      }
      iVar4 = iVar10;
      if (iVar16 < iVar10) {
        iVar4 = iVar16;
      }
      if (iVar12 < iVar11) {
        iVar12 = iVar11;
      }
      if (iVar16 < iVar10) {
        iVar16 = iVar10;
      }
      if ((((iVar18 < (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x) ||
           (iVar4 < (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y)) ||
          ((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x < iVar12)) ||
         ((this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y < iVar16)) {
        Warning(local_90,"Supplied pixel bounds extend beyond image resolution. Clamping.");
      }
      iVar10 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar11 = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>.y;
      if (iVar10 < iVar18) {
        iVar10 = iVar18;
      }
      if (iVar11 < iVar4) {
        iVar11 = iVar4;
      }
      TVar15.y = iVar11;
      TVar15.x = iVar10;
      iVar10 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      if (iVar10 < iVar12) {
        iVar12 = iVar10;
      }
      iVar10 = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      if (iVar10 < iVar16) {
        iVar16 = iVar10;
      }
      TVar26.y = iVar16;
      TVar26.x = iVar12;
      (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar15;
      (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar26;
    }
    else {
      local_60._M_dataplus._M_p._0_4_ =
           (int)(local_88._M_string_length - (long)local_88._M_dataplus._M_p >> 2);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<int>
                (&local_b0,"%d values supplied for \"pixelbounds\". Expected 4.",(int *)&local_60);
      Error(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"cropwindow","");
  ParameterDictionary::GetFloatArray
            ((vector<float,_std::allocator<float>_> *)&local_60,parameters,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if (*(char *)(Options + 0xd8) == '\x01') {
    fVar27 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
    auVar32 = ZEXT416((uint)(fVar27 * *(float *)(Options + 200)));
    auVar32 = vroundss_avx(auVar32,auVar32,10);
    iVar16 = (int)auVar32._0_4_;
    fVar31 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
    auVar32 = ZEXT416((uint)(fVar31 * *(float *)(Options + 0xcc)));
    auVar32 = vroundss_avx(auVar32,auVar32,10);
    iVar18 = (int)auVar32._0_4_;
    auVar32 = ZEXT416((uint)(fVar27 * *(float *)(Options + 0xd0)));
    auVar32 = vroundss_avx(auVar32,auVar32,10);
    iVar11 = (int)auVar32._0_4_;
    auVar32 = ZEXT416((uint)(fVar31 * *(float *)(Options + 0xd4)));
    auVar32 = vroundss_avx(auVar32,auVar32,10);
    iVar12 = (int)auVar32._0_4_;
    iVar10 = iVar16;
    if (iVar11 < iVar16) {
      iVar10 = iVar11;
    }
    iVar4 = iVar18;
    if (iVar12 < iVar18) {
      iVar4 = iVar12;
    }
    TVar23.y = iVar4;
    TVar23.x = iVar10;
    if (iVar11 < iVar16) {
      iVar11 = iVar16;
    }
    if (iVar12 < iVar18) {
      iVar12 = iVar18;
    }
    TVar22.y = iVar12;
    TVar22.x = iVar11;
    (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar23;
    (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar22;
    if (local_60._M_dataplus._M_p != (pointer)local_60._M_string_length) {
      Warning(local_90,
              "Crop window supplied on command line will override crop window specified with Film.")
      ;
    }
    if ((*(char *)(Options + 0xec) != '\0') ||
       (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length)) {
      Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.");
    }
  }
  else if (local_60._M_dataplus._M_p != (pointer)local_60._M_string_length) {
    if (*(char *)(Options + 0xec) == '\x01') {
      Warning(local_90,
              "Ignoring \"cropwindow\" since pixel bounds were specified on the command line.");
    }
    else if (local_60._M_string_length - (long)local_60._M_dataplus._M_p == 0x10) {
      if (local_88._M_dataplus._M_p != (pointer)local_88._M_string_length) {
        Warning(local_90,"Both pixel bounds and crop window were specified. Using the crop window.")
        ;
      }
      auVar32 = vminss_avx(ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 4)),
                           ZEXT416(*(uint *)local_60._M_dataplus._M_p));
      auVar34 = SUB6416(ZEXT464(0x3f800000),0);
      auVar29 = vminss_avx(auVar34,auVar32);
      auVar35 = ZEXT816(0) << 0x40;
      uVar6 = vcmpss_avx512f(auVar32,auVar35,1);
      auVar32 = vmaxss_avx(ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 4)),
                           ZEXT416(*(uint *)local_60._M_dataplus._M_p));
      auVar30 = vminss_avx(auVar34,auVar32);
      uVar7 = vcmpss_avx512f(auVar32,auVar35,1);
      auVar32 = vminss_avx(ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 0xc)),
                           ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 8)));
      auVar33 = vminss_avx(auVar34,auVar32);
      uVar8 = vcmpss_avx512f(auVar32,auVar35,1);
      auVar32 = vmaxss_avx(ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 0xc)),
                           ZEXT416(*(uint *)(local_60._M_dataplus._M_p + 8)));
      auVar34 = vminss_avx(auVar34,auVar32);
      uVar9 = vcmpss_avx512f(auVar32,auVar35,1);
      fVar27 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.x;
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar6 & 1) * auVar29._0_4_) * fVar27));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar16 = (int)auVar32._0_4_;
      fVar31 = (float)(this->fullResolution).super_Tuple2<pbrt::Point2,_int>.y;
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar8 & 1) * auVar33._0_4_) * fVar31));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar18 = (int)auVar32._0_4_;
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar7 & 1) * auVar30._0_4_) * fVar27));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar11 = (int)auVar32._0_4_;
      auVar32 = ZEXT416((uint)((float)((uint)!(bool)((byte)uVar9 & 1) * auVar34._0_4_) * fVar31));
      auVar32 = vroundss_avx(auVar32,auVar32,10);
      iVar12 = (int)auVar32._0_4_;
      iVar10 = iVar16;
      if (iVar11 < iVar16) {
        iVar10 = iVar11;
      }
      iVar4 = iVar18;
      if (iVar12 < iVar18) {
        iVar4 = iVar12;
      }
      TVar24.y = iVar4;
      TVar24.x = iVar10;
      if (iVar11 < iVar16) {
        iVar11 = iVar16;
      }
      if (iVar12 < iVar18) {
        iVar12 = iVar18;
      }
      TVar20.y = iVar12;
      TVar20.x = iVar11;
      (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int> = TVar24;
      (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int> = TVar20;
    }
    else {
      local_34 = (int)(local_60._M_string_length - (long)local_60._M_dataplus._M_p >> 2);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      detail::stringPrintfRecursive<int>
                (&local_b0,"%d values supplied for \"cropwindow\". Expected 4.",&local_34);
      Error(local_90,local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  auVar30._8_8_ = 0;
  auVar30._0_8_ = (this->pixelBounds).pMin.super_Tuple2<pbrt::Point2,_int>;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = (this->pixelBounds).pMax.super_Tuple2<pbrt::Point2,_int>;
  uVar13 = vpcmpd_avx512vl(auVar30,auVar33,5);
  if ((uVar13 & 3) == 0) {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"diagonal","");
    FVar28 = ParameterDictionary::GetOneFloat(parameters,&local_b0,35.0);
    this->diagonal = FVar28;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_60._M_dataplus._M_p,
                      local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_88._M_dataplus._M_p,
                      local_88.field_2._M_allocated_capacity - (long)local_88._M_dataplus._M_p);
    }
    return;
  }
  ErrorExit<pbrt::Bounds2<int>&>
            (local_90,"Degenerate pixel bounds provided to film: %s.",&this->pixelBounds);
}

Assistant:

FilmBaseParameters::FilmBaseParameters(const ParameterDictionary &parameters,
                                       FilterHandle filter, const PixelSensor *sensor,
                                       const FileLoc *loc)
    : filter(filter), sensor(sensor) {
    filename = parameters.GetOneString("filename", "");
    if (!Options->imageFile.empty()) {
        if (!filename.empty())
            Warning(loc,
                    "Output filename supplied on command line, \"%s\" will "
                    "override "
                    "filename provided in scene description file, \"%s\".",
                    Options->imageFile, filename);
        filename = Options->imageFile;
    } else if (filename.empty())
        filename = "pbrt.exr";

    fullResolution = Point2i(parameters.GetOneInt("xresolution", 1280),
                             parameters.GetOneInt("yresolution", 720));
    if (Options->quickRender) {
        fullResolution.x = std::max(1, fullResolution.x / 4);
        fullResolution.y = std::max(1, fullResolution.y / 4);
    }

    pixelBounds = Bounds2i(Point2i(0, 0), fullResolution);
    std::vector<int> pb = parameters.GetIntArray("pixelbounds");
    if (Options->pixelBounds) {
        Bounds2i newBounds = *Options->pixelBounds;
        if (Intersect(newBounds, pixelBounds) != newBounds)
            Warning(loc, "Supplied pixel bounds extend beyond image "
                         "resolution. Clamping.");
        pixelBounds = Intersect(newBounds, pixelBounds);

        if (!pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!pb.empty()) {
        if (pb.size() != 4)
            Error(loc, "%d values supplied for \"pixelbounds\". Expected 4.",
                  int(pb.size()));
        else {
            Bounds2i newBounds = Bounds2i({pb[0], pb[2]}, {pb[1], pb[3]});
            if (Intersect(newBounds, pixelBounds) != newBounds)
                Warning(loc, "Supplied pixel bounds extend beyond image "
                             "resolution. Clamping.");
            pixelBounds = Intersect(newBounds, pixelBounds);
        }
    }

    std::vector<Float> cr = parameters.GetFloatArray("cropwindow");
    if (Options->cropWindow) {
        Bounds2f crop = *Options->cropWindow;
        // Compute film image bounds
        pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                       std::ceil(fullResolution.y * crop.pMin.y)),
                               Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                       std::ceil(fullResolution.y * crop.pMax.y)));

        if (!cr.empty())
            Warning(loc, "Crop window supplied on command line will override "
                         "crop window specified with Film.");
        if (Options->pixelBounds || !pb.empty())
            Warning(loc, "Both pixel bounds and crop window were specified. Using the "
                         "crop window.");
    } else if (!cr.empty()) {
        if (Options->pixelBounds)
            Warning(loc, "Ignoring \"cropwindow\" since pixel bounds were specified "
                         "on the command line.");
        else if (cr.size() == 4) {
            if (!pb.empty())
                Warning(loc, "Both pixel bounds and crop window were "
                             "specified. Using the "
                             "crop window.");

            Bounds2f crop;
            crop.pMin.x = Clamp(std::min(cr[0], cr[1]), 0.f, 1.f);
            crop.pMax.x = Clamp(std::max(cr[0], cr[1]), 0.f, 1.f);
            crop.pMin.y = Clamp(std::min(cr[2], cr[3]), 0.f, 1.f);
            crop.pMax.y = Clamp(std::max(cr[2], cr[3]), 0.f, 1.f);

            // Compute film image bounds
            pixelBounds = Bounds2i(Point2i(std::ceil(fullResolution.x * crop.pMin.x),
                                           std::ceil(fullResolution.y * crop.pMin.y)),
                                   Point2i(std::ceil(fullResolution.x * crop.pMax.x),
                                           std::ceil(fullResolution.y * crop.pMax.y)));
        } else
            Error(loc, "%d values supplied for \"cropwindow\". Expected 4.",
                  (int)cr.size());
    }

    if (pixelBounds.IsEmpty())
        ErrorExit(loc, "Degenerate pixel bounds provided to film: %s.", pixelBounds);

    diagonal = parameters.GetOneFloat("diagonal", 35.);
}